

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_5x5(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int aiStack_98 [10];
  int workspace [25];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  for (lVar9 = 0; (int)lVar9 != 5; lVar9 = lVar9 + 1) {
    lVar13 = (long)*(short *)((long)pvVar4 + lVar9 * 2) * (long)coef_block[lVar9] * 0x2000;
    lVar16 = (long)*(short *)((long)pvVar4 + lVar9 * 2 + 0x20) * (long)coef_block[lVar9 + 0x10];
    lVar7 = (long)*(short *)((long)pvVar4 + lVar9 * 2 + 0x40) * (long)coef_block[lVar9 + 0x20];
    lVar14 = lVar7 + lVar16;
    lVar16 = lVar16 - lVar7;
    lVar12 = lVar16 * 0xb50 + lVar13 + 0x400;
    lVar7 = lVar12 + lVar14 * 0x194c;
    lVar12 = lVar12 + lVar14 * -0x194c;
    lVar19 = (long)*(short *)((long)pvVar4 + lVar9 * 2 + 0x10) * (long)coef_block[lVar9 + 8];
    lVar14 = (long)*(short *)((long)pvVar4 + lVar9 * 2 + 0x30) * (long)coef_block[lVar9 + 0x18];
    lVar17 = (lVar14 + lVar19) * 0x1a9a;
    lVar19 = lVar19 * 0x1071 + lVar17;
    lVar17 = lVar14 * -0x45a4 + lVar17;
    aiStack_98[lVar9] = (int)((ulong)(lVar19 + lVar7) >> 0xb);
    workspace[lVar9 + 10] = (int)((ulong)(lVar7 - lVar19) >> 0xb);
    aiStack_98[lVar9 + 5] = (int)((ulong)(lVar17 + lVar12) >> 0xb);
    workspace[lVar9 + 5] = (int)((ulong)(lVar12 - lVar17) >> 0xb);
    workspace[lVar9] = (int)(lVar13 + lVar16 * 0x7ffffffd2c0 + 0x400U >> 0xb);
  }
  uVar6 = (ulong)output_col;
  for (lVar9 = 0; lVar9 != 100; lVar9 = lVar9 + 0x14) {
    pJVar5 = *output_buf;
    iVar18 = *(int *)((long)aiStack_98 + lVar9 + 4);
    iVar11 = *(int *)((long)aiStack_98 + lVar9) * 0x2000;
    iVar15 = *(int *)((long)aiStack_98 + lVar9 + 8);
    iVar1 = *(int *)((long)aiStack_98 + lVar9 + 0x10);
    iVar2 = iVar1 + iVar15;
    iVar15 = iVar15 - iVar1;
    iVar10 = iVar15 * 0xb50 + iVar11 + 0x20000;
    iVar1 = iVar10 + iVar2 * 0x194c;
    iVar10 = iVar10 + iVar2 * -0x194c;
    iVar2 = *(int *)((long)aiStack_98 + lVar9 + 0xc);
    iVar8 = (iVar2 + iVar18) * 0x1a9a;
    iVar18 = iVar18 * 0x1071 + iVar8;
    iVar8 = iVar2 * -0x45a4 + iVar8;
    pJVar5[uVar6] = pJVar3[(ulong)((uint)(iVar18 + iVar1) >> 0x12 & 0x3ff) + 0x80];
    pJVar5[uVar6 + 4] = pJVar3[(ulong)((uint)(iVar1 - iVar18) >> 0x12 & 0x3ff) + 0x80];
    pJVar5[uVar6 + 1] = pJVar3[(ulong)((uint)(iVar8 + iVar10) >> 0x12 & 0x3ff) + 0x80];
    pJVar5[uVar6 + 3] = pJVar3[(ulong)((uint)(iVar10 - iVar8) >> 0x12 & 0x3ff) + 0x80];
    pJVar5[uVar6 + 2] =
         pJVar3[(ulong)(iVar11 + iVar15 * 0xfffd2c0 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
    output_buf = output_buf + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_5x5(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp10, tmp11, tmp12;
  JLONG z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[5 * 5];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp12 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp12 = LEFT_SHIFT(tmp12, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp12 += ONE << (CONST_BITS - PASS1_BITS - 1);
    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z1 = MULTIPLY(tmp0 + tmp1, FIX(0.790569415)); /* (c2+c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.353553391)); /* (c2-c4)/2 */
    z3 = tmp12 + z2;
    tmp10 = z3 + z1;
    tmp11 = z3 - z1;
    tmp12 -= LEFT_SHIFT(z2, 2);

    /* Odd part */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));     /* c3 */
    tmp0 = z1 + MULTIPLY(z2, FIX(0.513743148));   /* c1-c3 */
    tmp1 = z1 - MULTIPLY(z3, FIX(2.176250899));   /* c1+c3 */

    /* Final output stage */

    wsptr[5 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[5 * 4] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[5 * 1] = (int)RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[5 * 3] = (int)RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[5 * 2] = (int)RIGHT_SHIFT(tmp12, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 5 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp12 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp12 = LEFT_SHIFT(tmp12, CONST_BITS);
    tmp0 = (JLONG)wsptr[2];
    tmp1 = (JLONG)wsptr[4];
    z1 = MULTIPLY(tmp0 + tmp1, FIX(0.790569415)); /* (c2+c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.353553391)); /* (c2-c4)/2 */
    z3 = tmp12 + z2;
    tmp10 = z3 + z1;
    tmp11 = z3 - z1;
    tmp12 -= LEFT_SHIFT(z2, 2);

    /* Odd part */

    z2 = (JLONG)wsptr[1];
    z3 = (JLONG)wsptr[3];

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));     /* c3 */
    tmp0 = z1 + MULTIPLY(z2, FIX(0.513743148));   /* c1-c3 */
    tmp1 = z1 - MULTIPLY(z3, FIX(2.176250899));   /* c1+c3 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 5;         /* advance pointer to next row */
  }
}